

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O2

void __thiscall adios2::format::BP5Serializer::RecalcAttributeStorageSize(BP5Serializer *this)

{
  FMFieldList p_Var1;
  uint uVar2;
  long lVar3;
  void *pvVar4;
  
  lVar3 = (long)(this->Info).AttributeFieldCount;
  if (lVar3 != 0) {
    p_Var1 = (this->Info).AttributeFields;
    uVar2 = p_Var1[lVar3 + -1].field_offset + p_Var1[lVar3 + -1].field_size + 7U & 0xfffffff8;
    pvVar4 = realloc((this->Info).AttributeData,(long)(int)uVar2 + 8);
    (this->Info).AttributeData = pvVar4;
    lVar3 = (long)(this->Info).AttributeSize;
    memset((void *)((long)pvVar4 + lVar3),0,(int)uVar2 - lVar3);
    (this->Info).AttributeSize = uVar2;
  }
  return;
}

Assistant:

void BP5Serializer::RecalcAttributeStorageSize()
{
    if (Info.AttributeFieldCount)
    {
        FMFieldList LastAttributeField;
        size_t NewAttributeSize;
        LastAttributeField = &Info.AttributeFields[Info.AttributeFieldCount - 1];
        NewAttributeSize =
            (LastAttributeField->field_offset + LastAttributeField->field_size + 7) & ~7;
        Info.AttributeData = realloc(Info.AttributeData, NewAttributeSize + 8);
        memset((char *)(Info.AttributeData) + Info.AttributeSize, 0,
               NewAttributeSize - Info.AttributeSize);
        Info.AttributeSize = (int)NewAttributeSize;
    }
}